

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# v256_intrinsics_c.h
# Opt level: O3

c_v256 * c_v256_shr_s8(c_v256 *__return_storage_ptr__,c_v256 a,uint c)

{
  undefined1 auVar1 [16];
  undefined1 auVar2 [16];
  undefined1 auVar3 [16];
  undefined1 auVar4 [16];
  undefined1 auVar5 [32];
  undefined1 auVar6 [32];
  undefined1 auVar7 [32];
  undefined1 auVar8 [32];
  c_v256 cVar9;
  c_v256 *extraout_RAX;
  undefined1 auVar10 [32];
  undefined1 in_ZMM0 [64];
  
  auVar10 = in_ZMM0._0_32_;
  if (c < 8) {
    auVar1._8_8_ = 0;
    auVar1._0_8_ = a.u64[3];
    auVar10 = vpmovsxbd_avx2(auVar1);
    auVar2._8_8_ = 0;
    auVar2._0_8_ = a.u64[2];
    auVar5 = vpmovsxbd_avx2(auVar2);
    auVar6 = vpsrad_avx2(auVar10,ZEXT416(c));
    auVar7 = vpsrad_avx2(auVar5,ZEXT416(c));
    auVar3._8_8_ = 0;
    auVar3._0_8_ = a.u64[0];
    auVar10 = vpmovsxbd_avx2(auVar3);
    auVar4._8_8_ = 0;
    auVar4._0_8_ = a.u64[1];
    auVar5 = vpmovsxbd_avx2(auVar4);
    auVar5 = vpsrad_avx2(auVar5,ZEXT416(c));
    auVar8 = vpsrad_avx2(auVar10,ZEXT416(c));
    auVar10 = vpackssdw_avx2(auVar7,auVar6);
    auVar5 = vpackssdw_avx2(auVar8,auVar5);
    auVar10 = vpermq_avx2(auVar10,0xd8);
    auVar5 = vpermq_avx2(auVar5,0xd8);
    auVar10 = vpacksswb_avx2(auVar5,auVar10);
    cVar9 = (c_v256)vpermq_avx2(auVar10,0xd8);
    *__return_storage_ptr__ = cVar9;
    return __return_storage_ptr__;
  }
  c_v256_shr_s8();
  auVar5 = vpunpcklbw_avx2(auVar10,auVar10);
  auVar5 = vpsraw_avx2(auVar5,ZEXT416(c + 8));
  auVar10 = vpunpckhbw_avx2(auVar10,auVar10);
  auVar10 = vpsraw_avx2(auVar10,ZEXT416(c + 8));
  vpacksswb_avx2(auVar5,auVar10);
  return extraout_RAX;
}

Assistant:

SIMD_INLINE c_v256 c_v256_shr_s8(c_v256 a, unsigned int c) {
  return c_v256_from_v128(c_v128_shr_s8(a.v128[1], c),
                          c_v128_shr_s8(a.v128[0], c));
}